

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

mcu8str * mctools_absolute_path(mcu8str *__return_storage_ptr__,mcu8str *pathraw)

{
  int iVar1;
  mcu8str path;
  mcu8str cwd;
  mcu8str local_40;
  mcu8str local_28;
  
  mctools_impl_view_no_winnamespace(&local_40,pathraw);
  __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->buflen = 0;
  __return_storage_ptr__->owns_memory = 0;
  if (local_40.size != 0) {
    iVar1 = mctools_path_is_absolute(&local_40);
    if (iVar1 == 0) {
      mctools_get_current_working_dir();
      mctools_path_join(__return_storage_ptr__,&local_28,&local_40);
      mcu8str_dealloc(&local_28);
    }
    else {
      mcu8str_copy(__return_storage_ptr__,&local_40);
    }
    mctools_pathseps_platform(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_absolute_path( const mcu8str* pathraw )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(pathraw);
    mcu8str res = mcu8str_create_empty();
    if ( path.size == 0 )
      return res;
#ifdef MC_IS_WINDOWS
    {
      mcwinstr wpath = mc_path2wpath( &path );
      res = mc_winstr_expand_to_fullpath_u8str( &wpath );
      mc_winstr_dealloc(&wpath);
    }
    const int not_done = (res.size == 0?1:0);
#else
    const int not_done = 1;
#endif
    if ( not_done ) {
      if ( mctools_path_is_absolute(&path) ) {
        res = mcu8str_copy( &path );
      } else {
        mcu8str cwd = mctools_get_current_working_dir();
        res = mctools_path_join( &cwd, &path );
        mcu8str_dealloc(&cwd);
      }
    }
    mctools_pathseps_platform(&res);
    return res;
  }